

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParserTester_1000_1999.cpp
# Opt level: O0

void __thiscall psy::C::ParserTester::case1717(ParserTester *this)

{
  initializer_list<psy::C::SyntaxKind> __l;
  Expectation *pEVar1;
  allocator<psy::C::SyntaxKind> local_229;
  SyntaxKind local_228 [16];
  iterator local_208;
  size_type local_200;
  vector<psy::C::SyntaxKind,_std::allocator<psy::C::SyntaxKind>_> local_1f8;
  allocator<char> local_1d9;
  string local_1d8;
  Expectation local_1b8;
  Expectation local_100;
  allocator<char> local_31;
  string local_30;
  ParserTester *local_10;
  ParserTester *this_local;
  
  local_10 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"( x ) - 1",&local_31);
  Expectation::Expectation(&local_1b8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1d8,"",&local_1d9);
  pEVar1 = Expectation::ambiguity(&local_1b8,&local_1d8);
  local_228[0] = AmbiguousCastOrBinaryExpression;
  local_228[1] = CastExpression;
  local_228[2] = TypeName;
  local_228[3] = TypedefName;
  local_228[4] = AbstractDeclarator;
  local_228[5] = UnaryMinusExpression;
  local_228[6] = IntegerConstantExpression;
  local_228[7] = 0x44e;
  local_228[8] = ParenthesizedExpression;
  local_228[9] = IdentifierName;
  local_228[10] = IntegerConstantExpression;
  local_208 = local_228;
  local_200 = 0xb;
  std::allocator<psy::C::SyntaxKind>::allocator(&local_229);
  __l._M_len = local_200;
  __l._M_array = local_208;
  std::vector<psy::C::SyntaxKind,_std::allocator<psy::C::SyntaxKind>_>::vector
            (&local_1f8,__l,&local_229);
  pEVar1 = Expectation::AST(pEVar1,&local_1f8);
  Expectation::Expectation(&local_100,pEVar1);
  parseExpression(this,&local_30,&local_100);
  Expectation::~Expectation(&local_100);
  std::vector<psy::C::SyntaxKind,_std::allocator<psy::C::SyntaxKind>_>::~vector(&local_1f8);
  std::allocator<psy::C::SyntaxKind>::~allocator(&local_229);
  std::__cxx11::string::~string((string *)&local_1d8);
  std::allocator<char>::~allocator(&local_1d9);
  Expectation::~Expectation(&local_1b8);
  std::__cxx11::string::~string((string *)&local_30);
  std::allocator<char>::~allocator(&local_31);
  return;
}

Assistant:

void ParserTester::case1717()
{
    parseExpression("( x ) - 1",
                    Expectation().ambiguity()
                                 .AST( { SyntaxKind::AmbiguousCastOrBinaryExpression,
                                         SyntaxKind::CastExpression,
                                         SyntaxKind::TypeName,
                                         SyntaxKind::TypedefName,
                                         SyntaxKind::AbstractDeclarator,
                                         SyntaxKind::UnaryMinusExpression,
                                         SyntaxKind::IntegerConstantExpression,
                                         SyntaxKind::SubstractExpression,
                                         SyntaxKind::ParenthesizedExpression,
                                         SyntaxKind::IdentifierName,
                                         SyntaxKind::IntegerConstantExpression }));
}